

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TemplateTest.hpp
# Opt level: O0

void Qentem::Test::TestSuperVariableTag1(QTest *test)

{
  Value<char> *pVVar1;
  StringStream<char> *pSVar2;
  undefined1 local_38 [8];
  Value<char> value;
  StringStream<char> ss;
  QTest *test_local;
  
  StringStream<char>::StringStream((StringStream<char> *)&value.type_);
  Value<char>::Value((Value<char> *)local_38);
  pVVar1 = Value<char>::operator[]((Value<char> *)local_38,"a");
  Value<char>::operator=(pVVar1,"a");
  pVVar1 = Value<char>::operator[]((Value<char> *)local_38,"b");
  Value<char>::operator=(pVVar1,"bb");
  pVVar1 = Value<char>::operator[]((Value<char> *)local_38,"c");
  Value<char>::operator=(pVVar1,"ccc");
  pVVar1 = Value<char>::operator[]((Value<char> *)local_38,"d");
  Value<char>::operator=(pVVar1,"dddd");
  pVVar1 = Value<char>::operator[]((Value<char> *)local_38,"4");
  Value<char>::operator=(pVVar1,"e");
  pVVar1 = Value<char>::operator[]((Value<char> *)local_38,"e");
  Value<char>::operator=(pVVar1,"f");
  pVVar1 = Value<char>::operator[]((Value<char> *)local_38,"ffffff");
  Value<char>::operator=(pVVar1,"g");
  pVVar1 = Value<char>::operator[]((Value<char> *)local_38,"g");
  Value<char>::operator=(pVVar1,10);
  pVVar1 = Value<char>::operator[]((Value<char> *)local_38,"h");
  Value<char>::operator=(pVVar1,true);
  pVVar1 = Value<char>::operator[]((Value<char> *)local_38,"999999999");
  Value<char>::operator=(pVVar1,"8000000000007779999999");
  pVVar1 = Value<char>::operator[]((Value<char> *)local_38,"x_y_z");
  Value<char>::operator=(pVVar1,"the value is {0}");
  pSVar2 = Template::Render<char,Qentem::Value<char>,Qentem::StringStream<char>>
                     ("{svar:x_y_z, {var:a}}",(Value<char> *)local_38,
                      (StringStream<char> *)&value.type_);
  QTest::IsEqual<Qentem::StringStream<char>,char[15]>
            (test,pSVar2,(char (*) [15])"the value is a",0x8cc);
  StringStream<char>::Clear((StringStream<char> *)&value.type_);
  pSVar2 = Template::Render<char,Qentem::Value<char>,Qentem::StringStream<char>>
                     ("..{svar:x_y_z, {var:d}}--",(Value<char> *)local_38,
                      (StringStream<char> *)&value.type_);
  QTest::IsEqual<Qentem::StringStream<char>,char[22]>
            (test,pSVar2,(char (*) [22])"..the value is dddd--",0x8cf);
  StringStream<char>::Clear((StringStream<char> *)&value.type_);
  pSVar2 = Template::Render<char,Qentem::Value<char>,Qentem::StringStream<char>>
                     (".{svar:x_y_z, {var:g}}-",(Value<char> *)local_38,
                      (StringStream<char> *)&value.type_);
  QTest::IsEqual<Qentem::StringStream<char>,char[18]>
            (test,pSVar2,(char (*) [18])".the value is 10-",0x8d2);
  StringStream<char>::Clear((StringStream<char> *)&value.type_);
  pSVar2 = Template::Render<char,Qentem::Value<char>,Qentem::StringStream<char>>
                     (".{svar:x_y_z, {var:h}}",(Value<char> *)local_38,
                      (StringStream<char> *)&value.type_);
  QTest::IsEqual<Qentem::StringStream<char>,char[19]>
            (test,pSVar2,(char (*) [19])".the value is true",0x8d5);
  StringStream<char>::Clear((StringStream<char> *)&value.type_);
  pSVar2 = Template::Render<char,Qentem::Value<char>,Qentem::StringStream<char>>
                     ("{svar:x_y_z, {var:999999999}}x",(Value<char> *)local_38,
                      (StringStream<char> *)&value.type_);
  QTest::IsEqual<Qentem::StringStream<char>,char[37]>
            (test,pSVar2,(char (*) [37])"the value is 8000000000007779999999x",0x8d9);
  StringStream<char>::Clear((StringStream<char> *)&value.type_);
  pVVar1 = Value<char>::operator[]((Value<char> *)local_38,"x_y_z");
  Value<char>::operator=(pVVar1,"{0}");
  pSVar2 = Template::Render<char,Qentem::Value<char>,Qentem::StringStream<char>>
                     ("{svar:x_y_z, {var:4}}",(Value<char> *)local_38,
                      (StringStream<char> *)&value.type_);
  QTest::IsEqual<Qentem::StringStream<char>,char[2]>(test,pSVar2,(char (*) [2])0x13594d,0x8de);
  StringStream<char>::Clear((StringStream<char> *)&value.type_);
  pVVar1 = Value<char>::operator[]((Value<char> *)local_38,"x_y_z");
  Value<char>::operator=(pVVar1,"{0}{0} {0} {0}{0}{0}");
  pSVar2 = Template::Render<char,Qentem::Value<char>,Qentem::StringStream<char>>
                     ("{svar:x_y_z, {var:ffffff}}",(Value<char> *)local_38,
                      (StringStream<char> *)&value.type_);
  QTest::IsEqual<Qentem::StringStream<char>,char[9]>(test,pSVar2,(char (*) [9])"gg g ggg",0x8e3);
  StringStream<char>::Clear((StringStream<char> *)&value.type_);
  pVVar1 = Value<char>::operator[]((Value<char> *)local_38,"x_y_z");
  Value<char>::operator=(pVVar1,"{0},{1}.{2}-{3}**{4}////{5}=={6} {7} {8} {9}");
  pSVar2 = Template::Render<char,Qentem::Value<char>,Qentem::StringStream<char>>
                     ("{svar:x_y_z, {var:ffffff}, {var:a}, {var:4}, {var:999999999}, {var:g}, {var:h}, {var:c}, {var:d}, {var:b}, {var:e}}"
                      ,(Value<char> *)local_38,(StringStream<char> *)&value.type_);
  QTest::IsEqual<Qentem::StringStream<char>,char[56]>
            (test,pSVar2,(char (*) [56])"g,a.e-8000000000007779999999**10////true==ccc dddd bb f",
             0x8ec);
  StringStream<char>::Clear((StringStream<char> *)&value.type_);
  pVVar1 = Value<char>::operator[]((Value<char> *)local_38,"a");
  Value<char>::operator=(pVVar1,"\'a");
  pVVar1 = Value<char>::operator[]((Value<char> *)local_38,"b");
  Value<char>::operator=(pVVar1,"<>bb");
  pVVar1 = Value<char>::operator[]((Value<char> *)local_38,"x_y_z");
  Value<char>::operator=(pVVar1,"{0},{1}.{2}-{3}**{4}////{5}=={6} {7} {8} {9}");
  pSVar2 = Template::Render<char,Qentem::Value<char>,Qentem::StringStream<char>>
                     ("{svar:x_y_z, {var:ffffff}, {var:a}, {var:4}, {var:999999999}, {var:g}, {var:h}, {var:c}, {var:d}, {var:b}, {var:e}}"
                      ,(Value<char> *)local_38,(StringStream<char> *)&value.type_);
  QTest::IsEqual<Qentem::StringStream<char>,char[70]>
            (test,pSVar2,
             (char (*) [70])"g,&apos;a.e-8000000000007779999999**10////true==ccc dddd &lt;&gt;bb f",
             0x8f9);
  StringStream<char>::Clear((StringStream<char> *)&value.type_);
  pSVar2 = Template::Render<char,Qentem::Value<char>,Qentem::StringStream<char>>
                     ("{svar:x_y_z, {raw:ffffff}, {raw:a}, {raw:4}, {raw:999999999}, {raw:g}, {raw:h}, {raw:c}, {raw:d}, {raw:b}, {raw:e}}"
                      ,(Value<char> *)local_38,(StringStream<char> *)&value.type_);
  QTest::IsEqual<Qentem::StringStream<char>,char[59]>
            (test,pSVar2,
             (char (*) [59])"g,\'a.e-8000000000007779999999**10////true==ccc dddd <>bb f",0x908);
  StringStream<char>::Clear((StringStream<char> *)&value.type_);
  pVVar1 = Value<char>::operator[]((Value<char> *)local_38,"a");
  Value<char>::operator=(pVVar1,10);
  pVVar1 = Value<char>::operator[]((Value<char> *)local_38,"b");
  Value<char>::operator=(pVVar1,5);
  pVVar1 = Value<char>::operator[]((Value<char> *)local_38,"c");
  Value<char>::operator=(pVVar1,3);
  pVVar1 = Value<char>::operator[]((Value<char> *)local_38,"x_y_z");
  Value<char>::operator=(pVVar1,"{0} {1} {2} {3} {4}");
  pSVar2 = Template::Render<char,Qentem::Value<char>,Qentem::StringStream<char>>
                     ("{svar:x_y_z, {math:{var:a}+{var:b}+{var:c}},\n    {math:{var:a}*{var:b}*{var:c}},\n    {math:{var:a}-{var:b}-{var:c}},\n    {math:{var:a}+{var:b}-{var:c}},\n    {math:{var:a}/{var:b}+{var:c}}}"
                      ,(Value<char> *)local_38,(StringStream<char> *)&value.type_);
  QTest::IsEqual<Qentem::StringStream<char>,char[14]>
            (test,pSVar2,(char (*) [14])"18 150 2 12 5",0x917);
  Value<char>::~Value((Value<char> *)local_38);
  StringStream<char>::~StringStream((StringStream<char> *)&value.type_);
  return;
}

Assistant:

static void TestSuperVariableTag1(QTest &test) {
    StringStream<char> ss;
    Value<char>        value;

    value[R"(a)"]         = R"(a)";
    value[R"(b)"]         = R"(bb)";
    value[R"(c)"]         = R"(ccc)";
    value[R"(d)"]         = R"(dddd)";
    value[R"(4)"]         = R"(e)";
    value[R"(e)"]         = R"(f)";
    value[R"(ffffff)"]    = R"(g)";
    value[R"(g)"]         = 10;
    value[R"(h)"]         = true;
    value[R"(999999999)"] = R"(8000000000007779999999)";

    value[R"(x_y_z)"] = R"(the value is {0})";

    test.IsEqual(Template::Render(R"({svar:x_y_z, {var:a}})", value, ss), R"(the value is a)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(R"(..{svar:x_y_z, {var:d}}--)", value, ss), R"(..the value is dddd--)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(R"(.{svar:x_y_z, {var:g}}-)", value, ss), R"(.the value is 10-)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(R"(.{svar:x_y_z, {var:h}})", value, ss), R"(.the value is true)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(R"({svar:x_y_z, {var:999999999}}x)", value, ss),
                 R"(the value is 8000000000007779999999x)", __LINE__);
    ss.Clear();

    value[R"(x_y_z)"] = R"({0})";

    test.IsEqual(Template::Render(R"({svar:x_y_z, {var:4}})", value, ss), R"(e)", __LINE__);
    ss.Clear();

    value[R"(x_y_z)"] = R"({0}{0} {0} {0}{0}{0})";

    test.IsEqual(Template::Render(R"({svar:x_y_z, {var:ffffff}})", value, ss), R"(gg g ggg)", __LINE__);
    ss.Clear();

    value[R"(x_y_z)"] = R"({0},{1}.{2}-{3}**{4}////{5}=={6} {7} {8} {9})";

    test.IsEqual(
        Template::Render(
            R"({svar:x_y_z, {var:ffffff}, {var:a}, {var:4}, {var:999999999}, {var:g}, {var:h}, {var:c}, {var:d}, {var:b}, {var:e}})",
            value, ss),
        R"(g,a.e-8000000000007779999999**10////true==ccc dddd bb f)", __LINE__);
    ss.Clear();

    value[R"(a)"] = R"('a)";
    value[R"(b)"] = R"(<>bb)";

    value[R"(x_y_z)"] = R"({0},{1}.{2}-{3}**{4}////{5}=={6} {7} {8} {9})";

    if (Config::AutoEscapeHTML) {
        test.IsEqual(
            Template::Render(
                R"({svar:x_y_z, {var:ffffff}, {var:a}, {var:4}, {var:999999999}, {var:g}, {var:h}, {var:c}, {var:d}, {var:b}, {var:e}})",
                value, ss),
            R"(g,&apos;a.e-8000000000007779999999**10////true==ccc dddd &lt;&gt;bb f)", __LINE__);
    } else {
        test.IsEqual(
            Template::Render(
                R"({svar:x_y_z, {var:ffffff}, {var:a}, {var:4}, {var:999999999}, {var:g}, {var:h}, {var:c}, {var:d}, {var:b}, {var:e}})",
                value, ss),
            R"(g,'a.e-8000000000007779999999**10////true==ccc dddd <>bb f)", __LINE__);
    }

    ss.Clear();

    test.IsEqual(
        Template::Render(
            R"({svar:x_y_z, {raw:ffffff}, {raw:a}, {raw:4}, {raw:999999999}, {raw:g}, {raw:h}, {raw:c}, {raw:d}, {raw:b}, {raw:e}})",
            value, ss),
        R"(g,'a.e-8000000000007779999999**10////true==ccc dddd <>bb f)", __LINE__);
    ss.Clear();

    value[R"(a)"] = 10;
    value[R"(b)"] = 5;
    value[R"(c)"] = 3;

    value[R"(x_y_z)"] = R"({0} {1} {2} {3} {4})";

    test.IsEqual(Template::Render(R"({svar:x_y_z, {math:{var:a}+{var:b}+{var:c}},
    {math:{var:a}*{var:b}*{var:c}},
    {math:{var:a}-{var:b}-{var:c}},
    {math:{var:a}+{var:b}-{var:c}},
    {math:{var:a}/{var:b}+{var:c}}})",
                                  value, ss),
                 R"(18 150 2 12 5)", __LINE__);
}